

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

size_type __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase<long>(Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,key_arg<long> *key)

{
  iterator it;
  bool bVar1;
  pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
  local_58;
  iterator_base<google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  InnerMap::FindHelper<long>(&local_58,&this->elements_,key,(TreeIterator *)0x0);
  bVar1 = local_58.first.node_ != (Node *)0x0;
  if (bVar1) {
    local_30.node_ = local_58.first.node_;
    local_30.m_ = local_58.first.m_;
    local_30.bucket_index_ = local_58.first.bucket_index_;
    InnerMap::
    iterator_base<google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_30);
    it.m_ = local_58.first.m_;
    it.node_ = local_58.first.node_;
    it.bucket_index_ = local_58.first.bucket_index_;
    InnerMap::erase(&this->elements_,it);
  }
  return (ulong)bVar1;
}

Assistant:

size_type erase(const key_arg<K>& key) {
    iterator it = find(key);
    if (it == end()) {
      return 0;
    } else {
      erase(it);
      return 1;
    }
  }